

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O1

void pcap_cleanup_linux(pcap_t *handle)

{
  void *pvVar1;
  short sVar2;
  int iVar3;
  short sVar4;
  ifreq ifr;
  iwreq ireq;
  char local_78 [8];
  ulong uStack_70;
  ulong local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  char local_48 [15];
  undefined1 local_39;
  undefined4 local_38;
  
  pvVar1 = handle->priv;
  if (*(uint *)((long)pvVar1 + 0x30) == 0) goto LAB_0011aff7;
  if ((*(uint *)((long)pvVar1 + 0x30) & 1) != 0) {
    local_68 = 0;
    uStack_60 = 0;
    local_78[0] = '\0';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    local_78[4] = '\0';
    local_78[5] = '\0';
    local_78[6] = '\0';
    local_78[7] = '\0';
    uStack_70 = 0;
    local_58 = 0;
    strncpy(local_78,*(char **)((long)pvVar1 + 0x20),0x10);
    uStack_70 = uStack_70 & 0xffffffffffffff;
    iVar3 = ioctl(handle->fd,0x8913,local_78);
    if (iVar3 == -1) {
LAB_0011b060:
      pcap_cleanup_linux_cold_1();
    }
    else if (((uint)local_68 >> 8 & 1) != 0) {
      local_68 = local_68 & 0xfffffffffffffeff;
      iVar3 = ioctl(handle->fd,0x8914);
      if (iVar3 == -1) goto LAB_0011b060;
    }
  }
  if ((*(byte *)((long)pvVar1 + 0x30) & 2) != 0) {
    local_68 = 0;
    uStack_60 = 0;
    local_78[0] = '\0';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    local_78[4] = '\0';
    local_78[5] = '\0';
    local_78[6] = '\0';
    local_78[7] = '\0';
    uStack_70 = 0;
    local_58 = 0;
    strncpy(local_78,*(char **)((long)pvVar1 + 0x20),0x10);
    uStack_70 = uStack_70 & 0xffffffffffffff;
    iVar3 = ioctl(handle->fd,0x8913,local_78);
    sVar4 = 0;
    if ((iVar3 != -1) && (sVar2 = (short)local_68, sVar4 = 0, (local_68 & 1) != 0)) {
      local_68 = local_68 & 0xfffffffffffffffe;
      iVar3 = ioctl(handle->fd,0x8914);
      sVar4 = sVar2;
      if (iVar3 == -1) {
        sVar4 = 0;
      }
    }
    strncpy(local_48,*(char **)((long)pvVar1 + 0x20),0x10);
    local_39 = 0;
    local_38 = *(undefined4 *)((long)pvVar1 + 0x48);
    iVar3 = ioctl(handle->fd,0x8b06,local_48);
    if (iVar3 == -1) {
      pcap_cleanup_linux_cold_2();
    }
    if (sVar4 != 0) {
      local_68 = CONCAT62(local_68._2_6_,sVar4);
      iVar3 = ioctl(handle->fd,0x8914);
      if (iVar3 == -1) {
        pcap_cleanup_linux_cold_3();
      }
    }
  }
  pcap_remove_from_pcaps_to_close(handle);
LAB_0011aff7:
  if (*(void **)((long)pvVar1 + 0x50) != (void *)0x0) {
    free(*(void **)((long)pvVar1 + 0x50));
    *(undefined8 *)((long)pvVar1 + 0x50) = 0;
  }
  if (*(void **)((long)pvVar1 + 0x20) != (void *)0x0) {
    free(*(void **)((long)pvVar1 + 0x20));
    *(undefined8 *)((long)pvVar1 + 0x20) = 0;
  }
  pcap_cleanup_live_common(handle);
  return;
}

Assistant:

static void	pcap_cleanup_linux( pcap_t *handle )
{
	struct pcap_linux *handlep = handle->priv;
	struct ifreq	ifr;
#ifdef HAVE_LIBNL
	struct nl80211_state nlstate;
	int ret;
#endif /* HAVE_LIBNL */
#ifdef IW_MODE_MONITOR
	int oldflags;
	struct iwreq ireq;
#endif /* IW_MODE_MONITOR */

	if (handlep->must_do_on_close != 0) {
		/*
		 * There's something we have to do when closing this
		 * pcap_t.
		 */
		if (handlep->must_do_on_close & MUST_CLEAR_PROMISC) {
			/*
			 * We put the interface into promiscuous mode;
			 * take it out of promiscuous mode.
			 *
			 * XXX - if somebody else wants it in promiscuous
			 * mode, this code cannot know that, so it'll take
			 * it out of promiscuous mode.  That's not fixable
			 * in 2.0[.x] kernels.
			 */
			memset(&ifr, 0, sizeof(ifr));
			strlcpy(ifr.ifr_name, handlep->device,
			    sizeof(ifr.ifr_name));
			if (ioctl(handle->fd, SIOCGIFFLAGS, &ifr) == -1) {
				fprintf(stderr,
				    "Can't restore interface %s flags (SIOCGIFFLAGS failed: %s).\n"
				    "Please adjust manually.\n"
				    "Hint: This can't happen with Linux >= 2.2.0.\n",
				    handlep->device, strerror(errno));
			} else {
				if (ifr.ifr_flags & IFF_PROMISC) {
					/*
					 * Promiscuous mode is currently on;
					 * turn it off.
					 */
					ifr.ifr_flags &= ~IFF_PROMISC;
					if (ioctl(handle->fd, SIOCSIFFLAGS,
					    &ifr) == -1) {
						fprintf(stderr,
						    "Can't restore interface %s flags (SIOCSIFFLAGS failed: %s).\n"
						    "Please adjust manually.\n"
						    "Hint: This can't happen with Linux >= 2.2.0.\n",
						    handlep->device,
						    strerror(errno));
					}
				}
			}
		}

#ifdef HAVE_LIBNL
		if (handlep->must_do_on_close & MUST_DELETE_MONIF) {
			ret = nl80211_init(handle, &nlstate, handlep->device);
			if (ret >= 0) {
				ret = del_mon_if(handle, handle->fd, &nlstate,
				    handlep->device, handlep->mondevice);
				nl80211_cleanup(&nlstate);
			}
			if (ret < 0) {
				fprintf(stderr,
				    "Can't delete monitor interface %s (%s).\n"
				    "Please delete manually.\n",
				    handlep->mondevice, handle->errbuf);
			}
		}
#endif /* HAVE_LIBNL */

#ifdef IW_MODE_MONITOR
		if (handlep->must_do_on_close & MUST_CLEAR_RFMON) {
			/*
			 * We put the interface into rfmon mode;
			 * take it out of rfmon mode.
			 *
			 * XXX - if somebody else wants it in rfmon
			 * mode, this code cannot know that, so it'll take
			 * it out of rfmon mode.
			 */

			/*
			 * First, take the interface down if it's up;
			 * otherwise, we might get EBUSY.
			 * If we get errors, just drive on and print
			 * a warning if we can't restore the mode.
			 */
			oldflags = 0;
			memset(&ifr, 0, sizeof(ifr));
			strlcpy(ifr.ifr_name, handlep->device,
			    sizeof(ifr.ifr_name));
			if (ioctl(handle->fd, SIOCGIFFLAGS, &ifr) != -1) {
				if (ifr.ifr_flags & IFF_UP) {
					oldflags = ifr.ifr_flags;
					ifr.ifr_flags &= ~IFF_UP;
					if (ioctl(handle->fd, SIOCSIFFLAGS, &ifr) == -1)
						oldflags = 0;	/* didn't set, don't restore */
				}
			}

			/*
			 * Now restore the mode.
			 */
			strlcpy(ireq.ifr_ifrn.ifrn_name, handlep->device,
			    sizeof ireq.ifr_ifrn.ifrn_name);
			ireq.u.mode = handlep->oldmode;
			if (ioctl(handle->fd, SIOCSIWMODE, &ireq) == -1) {
				/*
				 * Scientist, you've failed.
				 */
				fprintf(stderr,
				    "Can't restore interface %s wireless mode (SIOCSIWMODE failed: %s).\n"
				    "Please adjust manually.\n",
				    handlep->device, strerror(errno));
			}

			/*
			 * Now bring the interface back up if we brought
			 * it down.
			 */
			if (oldflags != 0) {
				ifr.ifr_flags = oldflags;
				if (ioctl(handle->fd, SIOCSIFFLAGS, &ifr) == -1) {
					fprintf(stderr,
					    "Can't bring interface %s back up (SIOCSIFFLAGS failed: %s).\n"
					    "Please adjust manually.\n",
					    handlep->device, strerror(errno));
				}
			}
		}
#endif /* IW_MODE_MONITOR */

		/*
		 * Take this pcap out of the list of pcaps for which we
		 * have to take the interface out of some mode.
		 */
		pcap_remove_from_pcaps_to_close(handle);
	}

	if (handlep->mondevice != NULL) {
		free(handlep->mondevice);
		handlep->mondevice = NULL;
	}
	if (handlep->device != NULL) {
		free(handlep->device);
		handlep->device = NULL;
	}
	pcap_cleanup_live_common(handle);
}